

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

IndirOpnd * IR::IndirOpnd::New(RegOpnd *indexOpnd,int32 offset,byte scale,IRType type,Func *func)

{
  JitArenaAllocator *pJVar1;
  IndirOpnd *this;
  TrackAllocData local_50;
  IndirOpnd *local_28;
  IndirOpnd *indirOpnd;
  Func *func_local;
  IRType type_local;
  byte scale_local;
  RegOpnd *pRStack_10;
  int32 offset_local;
  RegOpnd *indexOpnd_local;
  
  pJVar1 = func->m_alloc;
  indirOpnd = (IndirOpnd *)func;
  func_local._2_1_ = type;
  func_local._3_1_ = scale;
  func_local._4_4_ = offset;
  pRStack_10 = indexOpnd;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
             ,0x9c0);
  pJVar1 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar1,&local_50);
  this = (IndirOpnd *)new<Memory::JitArenaAllocator>(0x48,pJVar1,0x4e98c0);
  IndirOpnd(this);
  this->m_func = (Func *)indirOpnd;
  local_28 = this;
  SetBaseOpnd(this,(RegOpnd *)0x0);
  SetOffset(local_28,func_local._4_4_,true);
  SetIndexOpnd(local_28,pRStack_10);
  (local_28->super_Opnd).m_type = func_local._2_1_;
  Opnd::SetIsJITOptimizedReg(&local_28->super_Opnd,false);
  (local_28->super_Opnd).m_kind = OpndKindIndir;
  local_28->m_scale = func_local._3_1_;
  return local_28;
}

Assistant:

IndirOpnd *
IndirOpnd::New(RegOpnd *indexOpnd, int32 offset, byte scale, IRType type, Func *func)
{
    IndirOpnd * indirOpnd;

    indirOpnd = JitAnew(func->m_alloc, IndirOpnd);

    indirOpnd->m_func = func;
    indirOpnd->SetBaseOpnd(nullptr);
    indirOpnd->SetOffset(offset, true);
    indirOpnd->SetIndexOpnd(indexOpnd);
    indirOpnd->m_type = type;
    indirOpnd->SetIsJITOptimizedReg(false);

    indirOpnd->m_kind = OpndKindIndir;

    indirOpnd->m_scale = scale;

    return indirOpnd;
}